

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

TV __thiscall Nova::Grid<float,_2>::Node(Grid<float,_2> *this,T_INDEX *index)

{
  int in_EDX;
  Vector<float,_2,_true> VVar1;
  T_STORAGE local_40;
  Vector<float,_2,_true> data_copy;
  Vector<int,_2,_true> local_30;
  
  Vector<int,_2,_true>::operator-(&local_30,in_EDX);
  Vector<float,_2,_true>::Vector<int>((Vector<float,_2,_true> *)&local_40,&local_30);
  data_copy._data._M_elems = (T_STORAGE)(T_STORAGE)local_40._M_elems;
  Vector<float,_2,_true>::operator*=(&data_copy,(Vector<float,_2,_true> *)(index + 3));
  VVar1 = Vector<float,_2,_true>::operator+
                    ((Vector<float,_2,_true> *)this,(Vector<float,_2,_true> *)(index + 1));
  return (TV)VVar1._data._M_elems;
}

Assistant:

TV Node(const T_INDEX& index) const
    {
        return domain.min_corner+TV(index-1)*dX;
    }